

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getmetatable(lua_State *L,int objindex)

{
  StkId pTVar1;
  int iVar2;
  TValue *pTVar3;
  Table *x_;
  TValue *io;
  Table *pTStack_28;
  int res;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  io._4_4_ = 0;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3a0,"int lua_getmetatable(lua_State *, int)");
  }
  pTVar3 = index2addr(L,objindex);
  switch(pTVar3->tt_ & 0x7f) {
  case 5:
    if (pTVar3->tt_ != 0x8005) {
      __assert_fail("((((obj))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3a8,"int lua_getmetatable(lua_State *, int)");
    }
    if (((pTVar3->value_).gc)->tt != '\x05') {
      __assert_fail("(((obj)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3a8,"int lua_getmetatable(lua_State *, int)");
    }
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x28);
    break;
  default:
    pTStack_28 = L->l_G->mt[(int)(pTVar3->tt_ & 0xf)];
    break;
  case 7:
    if (pTVar3->tt_ != 0x8007) {
      __assert_fail("((((obj))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3ab,"int lua_getmetatable(lua_State *, int)");
    }
    if (((pTVar3->value_).gc)->tt != '\a') {
      __assert_fail("(((obj)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3ab,"int lua_getmetatable(lua_State *, int)");
    }
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x10);
    break;
  case 0x15:
  case 0x25:
    if ((pTVar3->tt_ != 0x8015) && (pTVar3->tt_ != 0x8025)) {
      __assert_fail("(((((obj))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((obj))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3a5,"int lua_getmetatable(lua_State *, int)");
    }
    if ((((pTVar3->value_).gc)->tt != '\x15') && (((pTVar3->value_).gc)->tt != '%')) {
      __assert_fail("((((obj)->value_).gc)->tt == ((5) | ((1) << 4)) || (((obj)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3a5,"int lua_getmetatable(lua_State *, int)");
    }
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x38);
  }
  if (pTStack_28 != (Table *)0x0) {
    pTVar1 = L->top;
    if (9 < (pTStack_28->tt & 0xf)) {
      __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3b2,"int lua_getmetatable(lua_State *, int)");
    }
    (pTVar1->value_).gc = (GCObject *)pTStack_28;
    pTVar1->tt_ = 0x8005;
    if ((pTVar1->tt_ & 0x8000) != 0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3b2,"int lua_getmetatable(lua_State *, int)");
      }
      if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00114096:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3b2,"int lua_getmetatable(lua_State *, int)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3b2,"int lua_getmetatable(lua_State *, int)");
        }
        if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00114096;
      }
    }
    L->top = L->top + 1;
    if (L->ci->top < L->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x3b3,"int lua_getmetatable(lua_State *, int)");
    }
    io._4_4_ = 1;
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3b6,"int lua_getmetatable(lua_State *, int)");
  }
  return io._4_4_;
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt;
  int res = 0;
  lua_lock(L);
  obj = index2addr(L, objindex);
  switch (ttype(obj)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
      mt = arrvalue(obj)->metatable;
      break;
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(obj)];
      break;
  }
  if (mt != NULL) {
    sethvalue(L, L->top, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}